

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbwindow.cpp
# Opt level: O2

void __thiscall QXcbWindow::setImageFormatForVisual(QXcbWindow *this,xcb_visualtype_t *visual)

{
  uint uVar1;
  Format FVar2;
  bool bVar3;
  long in_FS_OFFSET;
  char local_38 [24];
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = qt_xcb_imageFormatForVisual
                    ((this->super_QXcbObject).m_connection,(uint8_t)this->m_depth,visual,
                     &this->m_imageFormat,&this->m_imageRgbSwap);
  if (!bVar3) {
    uVar1 = this->m_depth;
    if (uVar1 == 0x10) {
      local_38[0] = '\x02';
      local_38[1] = '\0';
      local_38[2] = '\0';
      local_38[3] = '\0';
      local_38[0x14] = '\0';
      local_38[0x15] = '\0';
      local_38[0x16] = '\0';
      local_38[0x17] = '\0';
      local_38[4] = '\0';
      local_38[5] = '\0';
      local_38[6] = '\0';
      local_38[7] = '\0';
      local_38[8] = '\0';
      local_38[9] = '\0';
      local_38[10] = '\0';
      local_38[0xb] = '\0';
      local_38[0xc] = '\0';
      local_38[0xd] = '\0';
      local_38[0xe] = '\0';
      local_38[0xf] = '\0';
      local_38[0x10] = '\0';
      local_38[0x11] = '\0';
      local_38[0x12] = '\0';
      local_38[0x13] = '\0';
      local_20 = "default";
      QMessageLogger::warning
                (local_38,
                 "Using RGB16 fallback, if this works your X11 server is reporting a bad screen format."
                );
      FVar2 = Format_RGB16;
    }
    else {
      if ((uVar1 != 0x20) && (uVar1 != 0x18)) goto LAB_001695ad;
      local_38[0] = '\x02';
      local_38[1] = '\0';
      local_38[2] = '\0';
      local_38[3] = '\0';
      local_38[0x14] = '\0';
      local_38[0x15] = '\0';
      local_38[0x16] = '\0';
      local_38[0x17] = '\0';
      local_38[4] = '\0';
      local_38[5] = '\0';
      local_38[6] = '\0';
      local_38[7] = '\0';
      local_38[8] = '\0';
      local_38[9] = '\0';
      local_38[10] = '\0';
      local_38[0xb] = '\0';
      local_38[0xc] = '\0';
      local_38[0xd] = '\0';
      local_38[0xe] = '\0';
      local_38[0xf] = '\0';
      local_38[0x10] = '\0';
      local_38[0x11] = '\0';
      local_38[0x12] = '\0';
      local_38[0x13] = '\0';
      local_20 = "default";
      QMessageLogger::warning
                (local_38,
                 "Using RGB32 fallback, if this works your X11 server is reporting a bad screen format."
                );
      FVar2 = Format_RGB32;
    }
    this->m_imageFormat = FVar2;
  }
LAB_001695ad:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXcbWindow::setImageFormatForVisual(const xcb_visualtype_t *visual)
{
    if (qt_xcb_imageFormatForVisual(connection(), m_depth, visual, &m_imageFormat, &m_imageRgbSwap))
        return;

    switch (m_depth) {
    case 32:
    case 24:
        qWarning("Using RGB32 fallback, if this works your X11 server is reporting a bad screen format.");
        m_imageFormat = QImage::Format_RGB32;
        break;
    case 16:
        qWarning("Using RGB16 fallback, if this works your X11 server is reporting a bad screen format.");
        m_imageFormat = QImage::Format_RGB16;
        break;
    default:
        break;
    }
}